

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O3

_Bool quest_monster_death_check(player *p,monster *mon)

{
  uint32_t *puVar1;
  quest_place *pqVar2;
  level_conflict *plVar3;
  bool bVar4;
  level_map_conflict *plVar5;
  _Bool _Var6;
  wchar_t wVar7;
  quest *pqVar8;
  level_conflict *plVar9;
  wchar_t *pwVar10;
  char *pcVar11;
  quest_place **ppqVar12;
  wchar_t place;
  uint uVar13;
  loc lVar14;
  ulong uVar15;
  ulong uVar16;
  loc lVar17;
  ulong uVar18;
  bool bVar19;
  loc local_40;
  loc local_38;
  
  place = (wchar_t)p->place;
  pqVar8 = find_quest(place);
  if (((pqVar8 == (quest *)0x0) || (mon->race != pqVar8->race)) || (pqVar8->complete != false)) {
    return false;
  }
  wVar7 = pqVar8->cur_num + L'\x01';
  pqVar8->cur_num = wVar7;
  plVar5 = world;
  if (wVar7 < pqVar8->max_num) goto LAB_001bd634;
  ppqVar12 = &pqVar8->place;
  do {
    pqVar2 = *ppqVar12;
    ppqVar12 = &pqVar2->next;
  } while (pqVar2->map != (level_map *)world);
  pqVar8->complete = true;
  if (pqVar2->block == true) {
    lVar17.x = (mon->grid).x;
    lVar17.y = (mon->grid).y;
    uVar16 = (ulong)lVar17 >> 0x20;
    plVar3 = plVar5->levels;
    lVar14 = lVar17;
    local_40 = lVar17;
    if (plVar3[place].down != (char *)0x0) {
      _Var6 = square_changeable(cave,lVar17);
      if (((_Var6) || (_Var6 = square_ispassable(cave,lVar17), !_Var6)) ||
         (_Var6 = square_isdoor(cave,lVar17), _Var6)) {
        lVar14 = (loc)((ulong)lVar17 & 0xffffffff);
      }
      else {
        do {
          scatter(cave,&local_40,lVar17,L'\x01',false);
          lVar17 = local_40;
          lVar14 = (loc)((ulong)local_40 & 0xffffffff);
          uVar16 = (ulong)local_40 >> 0x20;
          _Var6 = square_changeable(cave,local_40);
          if ((_Var6) || (_Var6 = square_ispassable(cave,lVar17), !_Var6)) break;
          _Var6 = square_isdoor(cave,lVar17);
        } while (!_Var6);
      }
      push_object(lVar17);
      msg("A magical staircase appears...");
      square_set_feat(cave,lVar17,FEAT_MORE);
      puVar1 = &p->upkeep->update;
      *puVar1 = *puVar1 | 0xc0;
    }
    uVar15 = (ulong)lVar14 & 0xffffffff;
    bVar19 = plVar3[place].north != (char *)0x0;
    local_38 = lVar14;
    if (bVar19) {
      plVar9 = level_by_name(world,plVar3[place].north);
      uVar18 = uVar16;
      if (1 < (int)uVar16) {
        lVar17 = (loc)(uVar16 << 0x20 | uVar15);
        do {
          _Var6 = square_ispermanent(cave,lVar17);
          if (_Var6) goto LAB_001bd3a2;
          square_set_feat(cave,lVar17,FEAT_ROAD);
          lVar17 = (loc)((long)lVar17 + -0x100000000);
          bVar4 = 2 < (long)uVar18;
          uVar18 = uVar18 - 1;
        } while (bVar4);
        uVar18 = 1;
      }
LAB_001bd3a2:
      if (plVar3[place].depth < plVar9->depth) {
        pwVar10 = &FEAT_MORE_NORTH;
      }
      else {
        pwVar10 = &FEAT_LESS_NORTH;
      }
      square_set_feat(cave,(loc)(uVar18 << 0x20 | uVar15),*pwVar10);
    }
    if (plVar3[place].east != (char *)0x0) {
      plVar9 = level_by_name(world,plVar3[place].east);
      uVar18 = (ulong)local_38 & 0xffffffff;
      if (local_38.x < cave->width + L'\xfffffffe') {
        do {
          lVar17 = (loc)(uVar18 | uVar16 << 0x20);
          _Var6 = square_ispermanent(cave,lVar17);
          if (_Var6) break;
          square_set_feat(cave,lVar17,FEAT_ROAD);
          uVar13 = (int)uVar18 + 1;
          uVar18 = (ulong)uVar13;
        } while ((int)uVar13 < cave->width + -2);
      }
      if (plVar3[place].depth < plVar9->depth) {
        pwVar10 = &FEAT_MORE_EAST;
      }
      else {
        pwVar10 = &FEAT_LESS_EAST;
      }
      square_set_feat(cave,(loc)(uVar16 << 0x20 | uVar18),*pwVar10);
      bVar19 = true;
    }
    if (plVar3[place].south == (char *)0x0) {
      pcVar11 = plVar3[place].west;
      if (pcVar11 != (char *)0x0) goto LAB_001bd56b;
      if (bVar19) goto LAB_001bd610;
    }
    else {
      plVar9 = level_by_name(world,plVar3[place].south);
      uVar18 = uVar16;
      if ((int)uVar16 < cave->height + -2) {
        do {
          lVar17 = (loc)(uVar18 << 0x20 | uVar15);
          _Var6 = square_ispermanent(cave,lVar17);
          if (_Var6) break;
          square_set_feat(cave,lVar17,FEAT_ROAD);
          uVar13 = (int)uVar18 + 1;
          uVar18 = (ulong)uVar13;
        } while ((int)uVar13 < cave->height + -2);
      }
      if (plVar3[place].depth < plVar9->depth) {
        pwVar10 = &FEAT_MORE_SOUTH;
      }
      else {
        pwVar10 = &FEAT_LESS_SOUTH;
      }
      square_set_feat(cave,(loc)(uVar18 << 0x20 | uVar15),*pwVar10);
      pcVar11 = plVar3[place].west;
      if (pcVar11 != (char *)0x0) {
LAB_001bd56b:
        plVar9 = level_by_name(world,pcVar11);
        wVar7 = local_38.x;
        if (L'\x01' < wVar7) {
          do {
            lVar17 = (loc)(uVar15 + (uVar16 << 0x20));
            _Var6 = square_ispermanent(cave,lVar17);
            if (_Var6) {
              wVar7 = (wchar_t)uVar15;
              goto LAB_001bd5df;
            }
            square_set_feat(cave,lVar17,FEAT_ROAD);
            bVar19 = 2 < (long)uVar15;
            uVar15 = uVar15 - 1;
          } while (bVar19);
          wVar7 = L'\x01';
        }
LAB_001bd5df:
        if (plVar3[place].depth < plVar9->depth) {
          pwVar10 = &FEAT_MORE_WEST;
        }
        else {
          pwVar10 = &FEAT_LESS_WEST;
        }
        square_set_feat(cave,(loc)(uVar16 << 0x20 | (ulong)(uint)wVar7),*pwVar10);
      }
LAB_001bd610:
      pcVar11 = locality_name(plVar3[place].locality);
      msg("The way out of %s is revealed!",pcVar11);
    }
  }
  puVar1 = &p->upkeep->update;
  *puVar1 = *puVar1 | 0x20;
LAB_001bd634:
  if ((pqVar8->type == L'\x03') && (pqVar8->complete == true)) {
    p->total_winner = 1;
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 2;
    msg("*** CONGRATULATIONS ***");
    msg("You have won the game!");
    msg("You may retire (key is shift-q) when you are ready.");
  }
  return true;
}

Assistant:

bool quest_monster_death_check(struct player *p, const struct monster *mon)
{
	struct quest *quest = find_quest(p->place);

	/* Simple checks */
	if (!quest) return false;
	if ((mon->race != quest->race) || quest->complete) return false;

	/* Increment count, check for completion */
	quest->cur_num++;
	if (quest->cur_num >= quest->max_num) {
		struct quest_place *place = find_quest_place(quest);
		quest->complete = true;

		/* Build magical stairs if needed */
		if (place->block) {
			build_quest_stairs(p, mon->grid);
		}

		/* Check specialties */
		p->upkeep->update |= (PU_SPECIALTY);
	}

	/* Game over... */
	if ((quest->type == QUEST_FINAL) && quest->complete) {
		p->total_winner = true;
		p->upkeep->redraw |= (PR_TITLE);
		msg("*** CONGRATULATIONS ***");
		msg("You have won the game!");
		msg("You may retire (key is shift-q) when you are ready.");
	}

	return true;
}